

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser * init_parse_monster(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_monster_name);
  parser_reg(p,"plural ?str plural",parse_monster_plural);
  parser_reg(p,"base sym base",parse_monster_base);
  parser_reg(p,"glyph char glyph",parse_monster_glyph);
  parser_reg(p,"color sym color",parse_monster_color);
  parser_reg(p,"speed int speed",parse_monster_speed);
  parser_reg(p,"hit-points int hp",parse_monster_hit_points);
  parser_reg(p,"light int light",parse_monster_light);
  parser_reg(p,"hearing int hearing",parse_monster_hearing);
  parser_reg(p,"smell int smell",parse_monster_smell);
  parser_reg(p,"armor-class int ac",parse_monster_armor_class);
  parser_reg(p,"sleepiness int sleep",parse_monster_sleepiness);
  parser_reg(p,"depth int level",parse_monster_depth);
  parser_reg(p,"rarity int rarity",parse_monster_rarity);
  parser_reg(p,"experience int mexp",parse_monster_experience);
  parser_reg(p,"blow sym method ?sym effect ?rand damage",parse_monster_blow);
  parser_reg(p,"flags ?str flags",parse_monster_flags);
  parser_reg(p,"flags-off ?str flags",parse_monster_flags_off);
  parser_reg(p,"desc str desc",parse_monster_desc);
  parser_reg(p,"innate-freq int freq",parse_monster_innate_freq);
  parser_reg(p,"spell-freq int freq",parse_monster_spell_freq);
  parser_reg(p,"spell-power uint power",parse_monster_spell_power);
  parser_reg(p,"spells str spells",parse_monster_spells);
  parser_reg(p,"message-vis sym spell ?str message",parse_monster_msg_vis);
  parser_reg(p,"message-invis sym spell ?str message",parse_monster_msg_invis);
  parser_reg(p,"message-miss sym spell ?str message",parse_monster_msg_miss);
  parser_reg(p,"drop sym tval sym sval uint chance uint min uint max",parse_monster_drop);
  parser_reg(p,"drop-base sym tval uint chance uint min uint max",parse_monster_drop_base);
  parser_reg(p,"friends uint chance rand number sym name ?sym role",parse_monster_friends);
  parser_reg(p,"friends-base uint chance rand number sym name ?sym role",parse_monster_friends_base)
  ;
  parser_reg(p,"mimic sym tval sym sval",parse_monster_mimic);
  parser_reg(p,"shape str name",parse_monster_shape);
  parser_reg(p,"color-cycle sym group sym cycle",parse_monster_color_cycle);
  return p;
}

Assistant:

struct parser *init_parse_monster(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);

	parser_reg(p, "name str name", parse_monster_name);
	parser_reg(p, "plural ?str plural", parse_monster_plural);
	parser_reg(p, "base sym base", parse_monster_base);
	parser_reg(p, "glyph char glyph", parse_monster_glyph);
	parser_reg(p, "color sym color", parse_monster_color);
	parser_reg(p, "speed int speed", parse_monster_speed);
	parser_reg(p, "hit-points int hp", parse_monster_hit_points);
	parser_reg(p, "light int light", parse_monster_light);
	parser_reg(p, "hearing int hearing", parse_monster_hearing);
	parser_reg(p, "smell int smell", parse_monster_smell);
	parser_reg(p, "armor-class int ac", parse_monster_armor_class);
	parser_reg(p, "sleepiness int sleep", parse_monster_sleepiness);
	parser_reg(p, "depth int level", parse_monster_depth);
	parser_reg(p, "rarity int rarity", parse_monster_rarity);
	parser_reg(p, "experience int mexp", parse_monster_experience);
	parser_reg(p, "blow sym method ?sym effect ?rand damage", parse_monster_blow);
	parser_reg(p, "flags ?str flags", parse_monster_flags);
	parser_reg(p, "flags-off ?str flags", parse_monster_flags_off);
	parser_reg(p, "desc str desc", parse_monster_desc);
	parser_reg(p, "innate-freq int freq", parse_monster_innate_freq);
	parser_reg(p, "spell-freq int freq", parse_monster_spell_freq);
	parser_reg(p, "spell-power uint power", parse_monster_spell_power);
	parser_reg(p, "spells str spells", parse_monster_spells);
	parser_reg(p, "message-vis sym spell ?str message", parse_monster_msg_vis);
	parser_reg(p, "message-invis sym spell ?str message", parse_monster_msg_invis);
	parser_reg(p, "message-miss sym spell ?str message", parse_monster_msg_miss);
	parser_reg(p, "drop sym tval sym sval uint chance uint min uint max", parse_monster_drop);
	parser_reg(p, "drop-base sym tval uint chance uint min uint max", parse_monster_drop_base);
	parser_reg(p, "friends uint chance rand number sym name ?sym role", parse_monster_friends);
	parser_reg(p, "friends-base uint chance rand number sym name ?sym role", parse_monster_friends_base);
	parser_reg(p, "mimic sym tval sym sval", parse_monster_mimic);
	parser_reg(p, "shape str name", parse_monster_shape);
	parser_reg(p, "color-cycle sym group sym cycle", parse_monster_color_cycle);
	return p;
}